

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::anon_unknown_37::PositiveAndNegativeUnitTestFilter::
PositiveAndNegativeUnitTestFilter(PositiveAndNegativeUnitTestFilter *this,string *filter)

{
  reference pvVar1;
  size_type sVar2;
  ulong uVar3;
  UnitTestFilter *pUVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t i;
  value_type negative_filter_string;
  value_type *positive_filter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  positive_and_negative_filters;
  UnitTestFilter *in_stack_fffffffffffffe08;
  UnitTestFilter *in_stack_fffffffffffffe10;
  UnitTestFilter *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe80;
  char in_stack_fffffffffffffe8f;
  string *in_stack_fffffffffffffe90;
  string local_120 [32];
  string local_100 [32];
  UnitTestFilter *local_e0;
  string local_d8 [32];
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  byte bVar5;
  _Alloc_hider in_stack_ffffffffffffff4f;
  UnitTestFilter *in_stack_ffffffffffffff50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  __lhs = in_RDI;
  UnitTestFilter::UnitTestFilter(in_stack_fffffffffffffe10);
  UnitTestFilter::UnitTestFilter(in_stack_fffffffffffffe10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x18a206);
  SplitString(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8f,in_stack_fffffffffffffe80);
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::front(&in_stack_fffffffffffffe10->glob_patterns_);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_28);
  if (sVar2 < 2) {
    UnitTestFilter::UnitTestFilter
              (in_stack_ffffffffffffff50,
               (string *)
               CONCAT17(in_stack_ffffffffffffff4f,
                        CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
    UnitTestFilter::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    UnitTestFilter::~UnitTestFilter(in_stack_fffffffffffffe10);
  }
  else {
    uVar3 = std::__cxx11::string::empty();
    bVar5 = 0;
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::string((string *)&stack0xffffffffffffff50,(string *)pvVar1);
    }
    else {
      in_stack_fffffffffffffe18 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xffffffffffffff4f;
      std::allocator<char>::allocator();
      bVar5 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    }
    UnitTestFilter::UnitTestFilter
              (in_stack_ffffffffffffff50,
               (string *)
               CONCAT17(in_stack_ffffffffffffff4f,CONCAT16(bVar5,in_stack_ffffffffffffff48)));
    UnitTestFilter::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    UnitTestFilter::~UnitTestFilter(in_stack_fffffffffffffe10);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
    if ((bVar5 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
    }
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_28,1);
    std::__cxx11::string::string(local_d8,(string *)pvVar1);
    local_e0 = (UnitTestFilter *)0x2;
    while (this_00 = local_e0,
          pUVar4 = (UnitTestFilter *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&local_28), this_00 < pUVar4) {
      std::operator+(__lhs,(char)((ulong)in_RDI >> 0x38));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_28,(size_type)local_e0);
      std::operator+(in_stack_fffffffffffffe18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      std::__cxx11::string::operator=(local_d8,local_100);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_120);
      local_e0 = (UnitTestFilter *)
                 ((long)&(local_e0->glob_patterns_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    UnitTestFilter::UnitTestFilter
              (in_stack_ffffffffffffff50,
               (string *)
               CONCAT17(in_stack_ffffffffffffff4f,CONCAT16(bVar5,in_stack_ffffffffffffff48)));
    UnitTestFilter::operator=(this_00,in_stack_fffffffffffffe08);
    UnitTestFilter::~UnitTestFilter(this_00);
    std::__cxx11::string::~string(local_d8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDI);
  return;
}

Assistant:

explicit PositiveAndNegativeUnitTestFilter(const std::string& filter) {
    std::vector<std::string> positive_and_negative_filters;

    // NOTE: `SplitString` always returns a non-empty container.
    SplitString(filter, '-', &positive_and_negative_filters);
    const auto& positive_filter = positive_and_negative_filters.front();

    if (positive_and_negative_filters.size() > 1) {
      positive_filter_ = UnitTestFilter(
          positive_filter.empty() ? kUniversalFilter : positive_filter);

      // TODO(b/214626361): Fail on multiple '-' characters
      // For the moment to preserve old behavior we concatenate the rest of the
      // string parts with `-` as separator to generate the negative filter.
      auto negative_filter_string = positive_and_negative_filters[1];
      for (std::size_t i = 2; i < positive_and_negative_filters.size(); i++)
        negative_filter_string =
            negative_filter_string + '-' + positive_and_negative_filters[i];
      negative_filter_ = UnitTestFilter(negative_filter_string);
    } else {
      // In case we don't have a negative filter and positive filter is ""
      // we do not use kUniversalFilter by design as opposed to when we have a
      // negative filter.
      positive_filter_ = UnitTestFilter(positive_filter);
    }
  }